

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_dynamic.cpp
# Opt level: O1

BinCompat * __thiscall ritobin::io::BinCompat::get(BinCompat *this,string_view name)

{
  BinCompat *pBVar1;
  int iVar2;
  char *__s;
  BinCompat *pBVar3;
  long lVar4;
  bool bVar5;
  
  lVar4 = 0;
  while( true ) {
    pBVar1 = *(BinCompat **)((long)&compat_impl::bin_versions + lVar4);
    __s = (char *)(*(code *)**(undefined8 **)pBVar1)(pBVar1);
    pBVar3 = (BinCompat *)strlen(__s);
    bVar5 = pBVar3 == this;
    if (bVar5 && this != (BinCompat *)0x0) {
      iVar2 = bcmp((void *)name._M_len,__s,(size_t)this);
      bVar5 = iVar2 == 0;
    }
    if (bVar5) break;
    lVar4 = lVar4 + 8;
    if (lVar4 == 0x10) {
      return (BinCompat *)0x0;
    }
  }
  return pBVar1;
}

Assistant:

BinCompat const* BinCompat::get(std::string_view name) noexcept {
        for (auto version: bin_versions) {
            if (version->name() == name) {
                return version;
            }
        }
        return nullptr;
    }